

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_paramSwitch_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  void *__s;
  ZSTD_strategy ZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  U32 UVar7;
  size_t bytes;
  U32 *pUVar8;
  BYTE *pBVar9;
  U64 UVar10;
  U64 UVar11;
  uint *puVar12;
  ZSTD_match_t *pZVar13;
  ZSTD_optimal_t *pZVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  ulong __n;
  ulong bytes_00;
  
  iVar6 = ZSTD_allocateChainTable
                    (cParams->strategy,useRowMatchFinder,
                     (uint)(forWho == ZSTD_resetTarget_CDict && ms->dedicatedDictSearch != 0));
  if (iVar6 == 0) {
    sVar18 = 0;
  }
  else {
    sVar18 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  bVar15 = (byte)cParams->hashLog;
  bytes = 1L << (bVar15 & 0x3f);
  uVar17 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    uVar17 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar17 = cParams->windowLog;
    }
  }
  if (useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x79b,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  if (forceResetIndex == ZSTDirp_reset) {
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    (ms->window).base = " ";
    (ms->window).dictBase = " ";
    (ms->window).dictLimit = 2;
    (ms->window).lowLimit = 2;
    (ms->window).nextSrc =
         (BYTE *)
         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx"
    ;
    ZSTD_cwksp_mark_tables_dirty(ws);
  }
  ms->hashLog3 = uVar17;
  ms->lazySkipping = 0;
  UVar7 = *(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base;
  (ms->window).lowLimit = UVar7;
  (ms->window).dictLimit = UVar7;
  ms->nextToUpdate = UVar7;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  if (ws->allocFailed == '\0') {
    ws->tableEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,4L << (bVar15 & 0x3f));
    ms->hashTable = pUVar8;
    pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar18);
    ms->chainTable = pUVar8;
    sVar18 = 4L << ((byte)uVar17 & 0x3f);
    if (uVar17 == 0) {
      sVar18 = 0;
    }
    pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar18);
    ms->hashTable3 = pUVar8;
    if (ws->allocFailed == '\0') {
      if (crp != ZSTDcrp_leaveDirty) {
        __s = ws->tableValidEnd;
        if (__s < ws->objectEnd) {
          __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                        ,0x237,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
        }
        if (ws->allocStart < __s) {
          __assert_fail("ws->tableValidEnd <= ws->allocStart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                        ,0x238,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
        }
        if (__s < ws->tableEnd) {
          memset(__s,0,(long)ws->tableEnd - (long)__s);
        }
        ZSTD_cwksp_mark_tables_clean(ws);
      }
      iVar6 = ZSTD_rowMatchFinderUsed(cParams->strategy,useRowMatchFinder);
      if (iVar6 != 0) {
        if (forWho == ZSTD_resetTarget_CCtx) {
          bytes_00 = bytes + 0x3f & 0xffffffffffffffc0;
          pBVar9 = (BYTE *)ZSTD_cwksp_reserve_internal
                                     (ws,bytes_00,ZSTD_cwksp_alloc_aligned_init_once);
          if (((ulong)pBVar9 & 0x3f) != 0) {
            __assert_fail("((size_t)ptr & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                          ,0x196,"void *ZSTD_cwksp_reserve_aligned_init_once(ZSTD_cwksp *, size_t)")
            ;
          }
          if ((pBVar9 != (BYTE *)0x0) && (pBVar9 < ws->initOnceStart)) {
            __n = (long)ws->initOnceStart - (long)pBVar9;
            if (bytes_00 <= __n) {
              __n = bytes_00;
            }
            memset(pBVar9,0,__n);
            ws->initOnceStart = pBVar9;
          }
          ms->tagTable = pBVar9;
          UVar10 = ZSTD_bitmix(ms->hashSalt,8);
          UVar11 = ZSTD_bitmix((ulong)ms->hashSaltEntropy,4);
          ms->hashSalt = UVar11 ^ UVar10;
        }
        else {
          pBVar9 = (BYTE *)ZSTD_cwksp_reserve_aligned(ws,bytes);
          ms->tagTable = pBVar9;
          memset(pBVar9,0,bytes);
          ms->hashSalt = 0;
        }
        uVar17 = 6;
        if (cParams->searchLog < 6) {
          uVar17 = cParams->searchLog;
        }
        uVar16 = 4;
        if (4 < uVar17) {
          uVar16 = uVar17;
        }
        if (cParams->hashLog < uVar16) {
          __assert_fail("cParams->hashLog >= rowLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x7c8,
                        "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                       );
        }
        ms->rowHashLog = cParams->hashLog - uVar16;
      }
      if ((forWho == ZSTD_resetTarget_CCtx) && (ZSTD_btlazy2 < cParams->strategy)) {
        puVar12 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
        (ms->opt).litFreq = puVar12;
        puVar12 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
        (ms->opt).litLengthFreq = puVar12;
        puVar12 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
        (ms->opt).matchLengthFreq = puVar12;
        puVar12 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
        (ms->opt).offCodeFreq = puVar12;
        pZVar13 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8008);
        (ms->opt).matchTable = pZVar13;
        pZVar14 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c01c);
        (ms->opt).priceTable = pZVar14;
      }
      uVar2 = cParams->windowLog;
      uVar3 = cParams->chainLog;
      uVar4 = cParams->hashLog;
      uVar5 = cParams->searchLog;
      uVar17 = cParams->minMatch;
      uVar16 = cParams->targetLength;
      ZVar1 = cParams->strategy;
      (ms->cParams).searchLog = cParams->searchLog;
      (ms->cParams).minMatch = uVar17;
      (ms->cParams).targetLength = uVar16;
      (ms->cParams).strategy = ZVar1;
      (ms->cParams).windowLog = uVar2;
      (ms->cParams).chainLog = uVar3;
      (ms->cParams).hashLog = uVar4;
      (ms->cParams).searchLog = uVar5;
      sVar18 = (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
    }
    else {
      sVar18 = 0xffffffffffffffc0;
    }
    return sVar18;
  }
  __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x7a6,
                "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
               );
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_paramSwitch_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_ps_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;
    ms->lazySkipping = 0;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        /* Row match finder needs an additional table of hashes ("tags") */
        size_t const tagTableSize = hSize;
        /* We want to generate a new salt in case we reset a Cctx, but we always want to use
         * 0 when we reset a Cdict */
        if(forWho == ZSTD_resetTarget_CCtx) {
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned_init_once(ws, tagTableSize);
            ZSTD_advanceHashSalt(ms);
        } else {
            /* When we are not salting we want to always memset the memory */
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            ZSTD_memset(ms->tagTable, 0, tagTableSize);
            ms->hashSalt = 0;
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = BOUNDED(4, cParams->searchLog, 6);
            assert(cParams->hashLog >= rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}